

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::Image::custom_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          function<void_(unsigned_int_&,_unsigned_int)> *per_pixel_fn)

{
  Image *pIVar1;
  bool bVar2;
  long y_00;
  uint32_t uVar3;
  bool bVar4;
  Image *pIVar5;
  Image *pIVar6;
  long extraout_RDX;
  ulong uVar7;
  Image *pIVar8;
  ulong uVar9;
  ulong uVar10;
  Image *this_00;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  long lStack_160;
  uint64_t uStack_148;
  uint64_t uStack_140;
  uint64_t uStack_138;
  unsigned_long uStack_130;
  unsigned_long uStack_128;
  unsigned_long uStack_120;
  ulong uStack_118;
  ulong uStack_110;
  long lStack_108;
  long lStack_100;
  ulong uStack_f8;
  Image *pIStack_f0;
  long lStack_e8;
  ssize_t sStack_e0;
  uint64_t uStack_d8;
  unsigned_long uStack_d0;
  Image *pIStack_c8;
  function<void_(unsigned_int_&,_unsigned_int)> *pfStack_c0;
  long lStack_b8;
  Image *pIStack_b0;
  long lStack_a8;
  code *pcStack_a0;
  undefined2 uStack_90;
  uint local_8c;
  ulong local_88;
  undefined4 uStack_80;
  uint32_t local_7c;
  ulong local_78;
  ulong local_70;
  long local_68;
  Image *local_60;
  Image *local_58;
  long local_50;
  long local_48;
  Image *local_40;
  ssize_t local_38;
  
  lVar17 = source->width;
  lVar18 = source->height;
  if (w < 0) {
    w = lVar17;
  }
  if (h < 0) {
    h = lVar18;
  }
  uVar11 = sx >> 0x3f & sx;
  pIVar6 = (Image *)(x - uVar11);
  pIVar8 = (Image *)0x0;
  if (sx < 1) {
    sx = (ssize_t)pIVar8;
  }
  uVar13 = sy >> 0x3f & sy;
  pIVar5 = (Image *)(y - uVar13);
  if (sy < 1) {
    sy = (ssize_t)pIVar8;
  }
  local_58 = (Image *)0x0;
  if (0 < (long)pIVar6) {
    local_58 = pIVar6;
  }
  if (-1 < (long)pIVar6) {
    pIVar6 = pIVar8;
  }
  uVar11 = (long)&pIVar6->width + uVar11 + w;
  local_50 = sx - (long)pIVar6;
  pIVar6 = (Image *)0x0;
  if (0 < (long)pIVar5) {
    pIVar6 = pIVar5;
  }
  if (-1 < (long)pIVar5) {
    pIVar5 = pIVar8;
  }
  uVar15 = (long)&pIVar5->width + uVar13 + h;
  local_48 = sy - (long)pIVar5;
  uVar13 = lVar17 - local_50;
  if ((long)(uVar11 + local_50) <= lVar17) {
    uVar13 = uVar11;
  }
  uVar11 = lVar18 - local_48;
  if ((long)(uVar15 + local_48) <= lVar18) {
    uVar11 = uVar15;
  }
  uVar15 = this->width - (long)local_58;
  if ((long)((long)&local_58->width + uVar13) <= this->width) {
    uVar15 = uVar13;
  }
  local_78 = this->height - (long)pIVar6;
  if ((long)((long)&pIVar6->width + uVar11) <= this->height) {
    local_78 = uVar11;
  }
  bVar19 = -1 < (long)(uVar15 | local_78);
  if ((bVar19) && (0 < (long)local_78)) {
    bVar4 = 0 < (long)uVar15 && -1 < (long)local_78;
    local_88 = 0;
    local_70 = uVar15;
    local_60 = pIVar6;
    local_40 = source;
    do {
      if (bVar4) {
        local_38 = local_48 + local_88;
        local_68 = (long)&local_60->width + local_88;
        lVar18 = 1;
        uVar11 = local_88;
        pIVar8 = local_58;
        lVar17 = local_50;
        do {
          pcStack_a0 = (code *)0x10b6bb;
          uVar3 = read_pixel(local_40,lVar17,local_38);
          pcStack_a0 = (code *)0x10b6cd;
          pIVar5 = pIVar8;
          this_00 = this;
          local_8c = read_pixel(this,(ssize_t)pIVar8,local_68);
          local_7c = uVar3;
          if (*(long *)(per_pixel_fn + 0x10) == 0) {
            pcStack_a0 = custom_blit;
            ::std::__throw_bad_function_call();
            pfStack_c0 = per_pixel_fn;
            uVar10 = CONCAT44(local_8c,CONCAT13(bVar4,CONCAT12(bVar19,uStack_90)));
            pIVar1 = (Image *)pIVar5->width;
            uVar13 = pIVar5->height;
            if ((long)pIVar6 < 0) {
              pIVar6 = pIVar1;
            }
            if ((long)uVar15 < 0) {
              uVar15 = uVar13;
            }
            uVar12 = (long)(int)local_8c >> 0x1f & uVar10;
            uVar7 = extraout_RDX - uVar12;
            uVar9 = 0;
            if ((long)uVar10 < 1) {
              uVar10 = uVar9;
            }
            uVar14 = (long)local_88 >> 0x3f & local_88;
            uVar11 = uVar11 - uVar14;
            uVar16 = local_88;
            if ((long)local_88 < 1) {
              uVar16 = uVar9;
            }
            uStack_110 = 0;
            if (0 < (long)uVar7) {
              uStack_110 = uVar7;
            }
            if (-1 < (long)uVar7) {
              uVar7 = uVar9;
            }
            uVar12 = (long)&pIVar6->width + uVar7 + uVar12;
            lStack_108 = uVar10 - uVar7;
            uStack_118 = 0;
            if (0 < (long)uVar11) {
              uStack_118 = uVar11;
            }
            if (-1 < (long)uVar11) {
              uVar11 = uVar9;
            }
            uVar15 = uVar14 + uVar15 + uVar11;
            lStack_100 = uVar16 - uVar11;
            uVar11 = (long)pIVar1 - lStack_108;
            if ((long)(uVar12 + lStack_108) <= (long)pIVar1) {
              uVar11 = uVar12;
            }
            uVar10 = uVar13 - lStack_100;
            if ((long)(uVar15 + lStack_100) <= (long)uVar13) {
              uVar10 = uVar15;
            }
            uStack_f8 = this_00->width - uStack_110;
            if ((long)(uVar11 + uStack_110) <= this_00->width) {
              uStack_f8 = uVar11;
            }
            uVar11 = this_00->height - uStack_118;
            if ((long)(uVar10 + uStack_118) <= this_00->height) {
              uVar11 = uVar10;
            }
            bVar19 = -1 < (long)(uStack_f8 | uVar11);
            if ((bVar19) && (0 < (long)uVar11)) {
              bVar4 = 0 < (long)uStack_f8;
              lStack_160 = 0;
              pIStack_f0 = this_00;
              pIStack_c8 = pIVar8;
              lStack_b8 = lVar17;
              pIStack_b0 = this;
              lStack_a8 = lVar18;
              pcStack_a0 = (code *)(ulong)uVar3;
              do {
                if (bVar4 && -1 < (long)uVar11) {
                  sStack_e0 = lStack_100 + lStack_160;
                  lStack_e8 = uStack_118 + lStack_160;
                  lVar18 = 1;
                  lVar17 = lStack_108;
                  uVar13 = uStack_110;
                  do {
                    read_pixel(pIVar5,lVar17,sStack_e0,&uStack_120,&uStack_d0,&uStack_128,
                               &uStack_130);
                    y_00 = lStack_e8;
                    read_pixel(this_00,uVar13,lStack_e8,&uStack_138,&uStack_140,&uStack_148,
                               &uStack_d8);
                    ::std::
                    function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
                    ::operator()((function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
                                  *)CONCAT44(local_7c,uStack_80),&uStack_138,&uStack_140,&uStack_148
                                 ,&uStack_d8,uStack_120,uStack_d0,uStack_128,uStack_130);
                    write_pixel(this_00,uVar13,y_00,uStack_138,uStack_140,uStack_148,uStack_d8);
                    bVar2 = lVar18 < (long)uStack_f8;
                    uVar13 = uVar13 + 1;
                    lVar17 = lVar17 + 1;
                    lVar18 = lVar18 + 1;
                  } while (bVar19 && bVar2);
                }
                lStack_160 = lStack_160 + 1;
              } while (bVar19 && lStack_160 < (long)uVar11);
            }
            return;
          }
          pcStack_a0 = (code *)0x10b6f3;
          (**(code **)(per_pixel_fn + 0x18))(per_pixel_fn,&local_8c,&local_7c);
          uVar11 = (ulong)(local_8c >> 0x18);
          pIVar6 = (Image *)(ulong)(local_8c >> 0x10 & 0xff);
          uVar15 = (ulong)(local_8c >> 8 & 0xff);
          pcStack_a0 = (code *)0x10b72a;
          write_pixel(this,(ssize_t)pIVar8,local_68,uVar11,(uint64_t)pIVar6,uVar15,
                      (ulong)(local_8c & 0xff));
          bVar2 = lVar18 < (long)local_70;
          pIVar8 = (Image *)((long)&pIVar8->width + 1);
          lVar17 = lVar17 + 1;
          lVar18 = lVar18 + 1;
        } while (bVar19 && bVar2);
      }
      local_88 = local_88 + 1;
    } while (bVar19 && (long)local_88 < (long)local_78);
  }
  return;
}

Assistant:

void Image::custom_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy,
    function<void(uint32_t&, uint32_t)> per_pixel_fn) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint32_t sc = source.read_pixel(sx + xx, sy + yy);
      uint32_t dc = this->read_pixel(x + xx, y + yy);
      per_pixel_fn(dc, sc);
      this->write_pixel(x + xx, y + yy, dc);
    }
  }
}